

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O3

wchar_t project_player_handler_DISEN(project_player_handler_context_t *context)

{
  _Bool _Var1;
  source origin;
  
  _Var1 = player_resists(player,L'\f');
  if (_Var1) {
    msg("You resist the effect!");
  }
  else {
    origin._4_4_ = 0;
    origin.what = (context->origin).what;
    origin.which.trap = (context->origin).which.trap;
    effect_simple(L'/',origin,"0",L'\0',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
  }
  return L'\0';
}

Assistant:

static int project_player_handler_DISEN(project_player_handler_context_t *context)
{
	if (player_resists(player, ELEM_DISEN)) {
		msg("You resist the effect!");
		return 0;
	}

	/* Disenchant gear */
	effect_simple(EF_DISENCHANT, context->origin, "0", 0, 0, 0, 0, 0, NULL);
	return 0;
}